

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

void pull_bytes(void *dst,size_t len,uchar **cursor,size_t *max)

{
  size_t *max_local;
  uchar **cursor_local;
  size_t len_local;
  void *dst_local;
  
  if (*max < len) {
    memcpy(dst,*cursor,*max);
    memset((void *)((long)dst + *max),0,len - *max);
    pull_failed(cursor,max);
  }
  else {
    memcpy(dst,*cursor,len);
    *cursor = *cursor + len;
    *max = *max - len;
  }
  return;
}

Assistant:

void pull_bytes(void *dst, size_t len,
                const unsigned char **cursor, size_t *max)
{
    if (len > *max) {
        memcpy(dst, *cursor, *max);
        memset((char *)dst + *max, 0, len - *max);
        pull_failed(cursor, max);
        return;
    }
    memcpy(dst, *cursor, len);
    *cursor += len;
    *max -= len;
}